

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidget.cpp
# Opt level: O1

QString * buddyString(QString *__return_storage_ptr__,QWidget *widget)

{
  long lVar1;
  QLabel *this;
  QWidget *pQVar2;
  QGroupBox *this_00;
  long lVar3;
  
  if ((widget == (QWidget *)0x0) ||
     (lVar1 = *(long *)(*(long *)&widget->field_0x8 + 0x10), lVar1 == 0)) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    lVar1 = *(long *)(*(long *)(lVar1 + 8) + 0x28);
    if (lVar1 != 0) {
      lVar3 = 0;
      do {
        this = (QLabel *)QMetaObject::cast((QObject *)&QLabel::staticMetaObject);
        if ((this != (QLabel *)0x0) && (pQVar2 = QLabel::buddy(this), pQVar2 == widget)) {
          QLabel::text(__return_storage_ptr__,this);
          return __return_storage_ptr__;
        }
        lVar3 = lVar3 + 8;
      } while (lVar1 << 3 != lVar3);
    }
    this_00 = (QGroupBox *)QMetaObject::cast((QObject *)&QGroupBox::staticMetaObject);
    if (this_00 == (QGroupBox *)0x0) {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
      (__return_storage_ptr__->d).size = 0;
    }
    else {
      QGroupBox::title(__return_storage_ptr__,this_00);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static QString buddyString(const QWidget *widget)
{
    if (!widget)
        return QString();
    QWidget *parent = widget->parentWidget();
    if (!parent)
        return QString();
#if QT_CONFIG(shortcut) && QT_CONFIG(label)
    for (QObject *o : parent->children()) {
        QLabel *label = qobject_cast<QLabel*>(o);
        if (label && label->buddy() == widget)
            return label->text();
    }
#endif

#if QT_CONFIG(groupbox)
    QGroupBox *groupbox = qobject_cast<QGroupBox*>(parent);
    if (groupbox)
        return groupbox->title();
#endif

    return QString();
}